

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall aggreports::LoadEnsembleMapping(aggreports *this)

{
  FILE *__stream;
  size_t sVar1;
  mapped_type *this_00;
  allocator_type local_59;
  Ensemble e;
  vector<int,_std::allocator<int>_> sidxtoensemble;
  value_type_conflict1 local_34;
  
  __stream = fopen("input/ensemble.bin","rb");
  if (__stream != (FILE *)0x0) {
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&sidxtoensemble,(long)this->samplesize_ + 1,&local_34,&local_59);
    sVar1 = fread(&e,8,1,__stream);
    while (sVar1 != 0) {
      sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[e.sidx] = e.ensemble_id;
      this_00 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->ensembletosidx_,&e.ensemble_id);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&e.sidx);
      sVar1 = fread(&e,8,1,__stream);
    }
    while (sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start =
                sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1,
          sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
      if (*sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start == 0) {
        fwrite("FATAL: All sidx must have associated ensemble IDs\n",0x32,1,_stderr);
        exit(1);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&sidxtoensemble.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void aggreports::LoadEnsembleMapping() {

  FILE *fin = fopen(ENSEMBLE_FILE, "rb");
  if (fin == NULL) return;

  Ensemble e;
  std::vector<int> sidxtoensemble(samplesize_+1, 0);
  size_t i = fread(&e, sizeof(Ensemble), 1, fin);
  while (i != 0) {
    sidxtoensemble[e.sidx] = e.ensemble_id;
    ensembletosidx_[e.ensemble_id].push_back(e.sidx);
    i = fread(&e, sizeof(Ensemble), 1, fin);
  }

  // Check all sidx have ensemble IDs
  for (std::vector<int>::const_iterator it = std::next(sidxtoensemble.begin());
       it != sidxtoensemble.end(); ++it) {
    if (*it == 0) {
      fprintf(stderr, "FATAL: All sidx must have associated ensemble IDs\n");
      exit(EXIT_FAILURE);
    }
  }

}